

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_port.cc
# Opt level: O3

bool __thiscall
raptor::anon_unknown_5::DoSplitHostPort
          (anon_unknown_5 *this,StringView name,StringView *host,StringView *port,bool *has_port)

{
  anon_unknown_5 *__s;
  void *pvVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 *puVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  puVar4 = (undefined8 *)name._size;
  pcVar6 = name._ptr;
  *(undefined1 *)&port->_ptr = 0;
  if (*this == (anon_unknown_5)0x5b) {
    if ((char *)0x1 < pcVar6) {
      __s = this + 1;
      pcVar5 = pcVar6 + -1;
      pvVar1 = memchr(__s,0x5d,(size_t)pcVar5);
      pcVar2 = (char *)((long)pvVar1 - (long)this);
      if (pcVar2 != (char *)0xffffffffffffffff && pvVar1 != (void *)0x0) {
        if (pcVar2 == pcVar5) {
          host->_ptr = (char *)0x0;
          host->_size = 0;
        }
        else {
          if ((this + 1)[(long)pcVar2] != (anon_unknown_5)0x3a) {
            return false;
          }
          pcVar7 = pcVar6 + -(long)(pcVar2 + 2);
          if (pcVar6 + (-2 - (long)pcVar2) <= pcVar6 + -(long)(pcVar2 + 2)) {
            pcVar7 = pcVar6 + (-2 - (long)pcVar2);
          }
          host->_ptr = pcVar2 + (long)this + 2;
          host->_size = (size_t)pcVar7;
          *(undefined1 *)&port->_ptr = 1;
        }
        pcVar6 = pcVar2 + -1;
        if (pcVar5 < pcVar2 + -1) {
          pcVar6 = pcVar5;
        }
        *puVar4 = __s;
        puVar4[1] = pcVar6;
        if ((pcVar6 != (char *)0x0) &&
           (pvVar1 = memchr(__s,0x3a,(size_t)pcVar6),
           pvVar1 != (void *)0x0 && (long)pvVar1 - (long)__s != -1)) {
          return true;
        }
        *puVar4 = 0;
        puVar4[1] = 0;
      }
    }
    return false;
  }
  if (pcVar6 != (char *)0x0) {
    pvVar1 = memchr(this,0x3a,(size_t)pcVar6);
    pcVar5 = (char *)((long)pvVar1 - (long)this);
    if (pcVar5 != (char *)0xffffffffffffffff && pvVar1 != (void *)0x0) {
      pcVar2 = pcVar5 + 1;
      pcVar7 = pcVar6 + -(long)pcVar2;
      if (pcVar2 <= pcVar6 && pcVar7 != (char *)0x0) {
        pcVar7 = pcVar6 + -(long)pcVar2;
        pvVar1 = memchr(pcVar2 + (long)this,0x3a,(size_t)pcVar7);
        if (pvVar1 != (void *)0x0 && (long)pvVar1 - (long)this != -1) goto LAB_0010b78d;
      }
      pcVar3 = pcVar5;
      if (pcVar6 < pcVar5) {
        pcVar3 = pcVar6;
      }
      *puVar4 = this;
      puVar4[1] = pcVar3;
      pcVar3 = pcVar6 + ~(ulong)pcVar5;
      if (pcVar7 < pcVar6 + ~(ulong)pcVar5) {
        pcVar3 = pcVar7;
      }
      host->_ptr = pcVar2 + (long)this;
      host->_size = (size_t)pcVar3;
      *(undefined1 *)&port->_ptr = 1;
      return true;
    }
  }
LAB_0010b78d:
  *puVar4 = this;
  puVar4[1] = pcVar6;
  host->_ptr = (char *)0x0;
  host->_size = 0;
  return true;
}

Assistant:

bool DoSplitHostPort(StringView name, StringView* host, StringView* port,
                     bool* has_port) {
    *has_port = false;
    if (name[0] == '[') {
        /* Parse a bracketed host, typically an IPv6 literal. */
        const size_t rbracket = name.find(']', 1);
        if (rbracket == StringView::npos) {
            /* Unmatched [ */
            return false;
        }
        if (rbracket == name.size() - 1) {
            /* ]<end> */
            *port = StringView();
        } else if (name[rbracket + 1] == ':') {
            /* ]:<port?> */
            *port = name.substr(rbracket + 2, name.size() - rbracket - 2);
            *has_port = true;
        } else {
            /* ]<invalid> */
            return false;
        }
        *host = name.substr(1, rbracket - 1);
        if (host->find(':') == StringView::npos) {
            /* Require all bracketed hosts to contain a colon, because a hostname or
                IPv4 address should never use brackets. */
            *host = StringView();
            return false;
        }
    } else {
        size_t colon = name.find(':');
        if (colon != StringView::npos &&
            name.find(':', colon + 1) == StringView::npos) {
            /* Exactly 1 colon.  Split into host:port. */
            *host = name.substr(0, colon);
            *port = name.substr(colon + 1, name.size() - colon - 1);
            *has_port = true;
        } else {
            /* 0 or 2+ colons.  Bare hostname or IPv6 litearal. */
            *host = name;
            *port = StringView();
        }
    }
    return true;
}